

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::RecordImmediateDominators(MergeReturnPass *this,Function *function)

{
  bool bVar1;
  IRContext *this_00;
  DominatorAnalysis *this_01;
  BasicBlock *pBVar2;
  CFG *this_02;
  BasicBlock *pBVar3;
  Instruction *pIVar4;
  mapped_type *ppIVar5;
  BasicBlock *local_68;
  BasicBlock *local_60;
  BasicBlock *local_58;
  BasicBlock *dominator_bb;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  DominatorAnalysis *dom_tree;
  Function *function_local;
  MergeReturnPass *this_local;
  
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::GetDominatorAnalysis(this_00,function);
  join_0x00000010_0x00000000_ = Function::begin(function);
  _bb = Function::end(function);
  do {
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb);
    if (!bVar1) {
      return;
    }
    dominator_bb = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end2.iterator_);
    pBVar2 = DominatorAnalysisBase::ImmediateDominator
                       (&this_01->super_DominatorAnalysisBase,dominator_bb);
    local_58 = pBVar2;
    if (pBVar2 == (BasicBlock *)0x0) {
LAB_00426c7c:
      local_68 = dominator_bb;
      ppIVar5 = std::
                unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>_>
                ::operator[](&this->original_dominator_,&local_68);
      *ppIVar5 = (mapped_type)0x0;
    }
    else {
      this_02 = Pass::cfg((Pass *)this);
      pBVar3 = CFG::pseudo_entry_block(this_02);
      if (pBVar2 == pBVar3) goto LAB_00426c7c;
      pIVar4 = BasicBlock::terminator(local_58);
      local_60 = dominator_bb;
      ppIVar5 = std::
                unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::Instruction_*>_>_>
                ::operator[](&this->original_dominator_,&local_60);
      *ppIVar5 = pIVar4;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  } while( true );
}

Assistant:

void MergeReturnPass::RecordImmediateDominators(Function* function) {
  DominatorAnalysis* dom_tree = context()->GetDominatorAnalysis(function);
  for (BasicBlock& bb : *function) {
    BasicBlock* dominator_bb = dom_tree->ImmediateDominator(&bb);
    if (dominator_bb && dominator_bb != cfg()->pseudo_entry_block()) {
      original_dominator_[&bb] = dominator_bb->terminator();
    } else {
      original_dominator_[&bb] = nullptr;
    }
  }
}